

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turn.cpp
# Opt level: O1

void __thiscall Turn::Turn(Turn *this,int day,string *skill,ShiftType *shiftType)

{
  pointer pcVar1;
  uint uVar2;
  
  (this->nurses).super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nurses).super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nurses).super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->shiftType = shiftType;
  (this->skill)._M_dataplus._M_p = (pointer)&(this->skill).field_2;
  pcVar1 = (skill->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->skill,pcVar1,pcVar1 + skill->_M_string_length);
  this->day = day;
  uVar2 = CURRENT_ID + 1;
  this->id = CURRENT_ID;
  CURRENT_ID = uVar2;
  return;
}

Assistant:

Turn::Turn(const int day, const string &skill, const ShiftType *shiftType) : day(day), shiftType(shiftType), skill(skill) {
    id = CURRENT_ID++;
}